

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O3

LY_ERR lydjson_subtree_r(lyd_json_ctx *lydctx,lyd_node *parent,lyd_node **first_p,ly_set *parsed)

{
  char cVar1;
  ushort uVar2;
  size_t __n;
  lysc_node *plVar3;
  LY_ERR LVar4;
  int iVar5;
  LY_ERR LVar6;
  LY_ERR LVar7;
  LYJSON_PARSER_STATUS LVar8;
  void *pvVar9;
  char *pcVar10;
  char *pcVar11;
  lyd_node *plVar12;
  ly_err_item *plVar13;
  char *pcVar14;
  lys_module *plVar15;
  lysc_node **pplVar16;
  ly_ctx *plVar17;
  byte bVar18;
  size_t prefix_len;
  uint8_t *name_len;
  uint16_t uVar19;
  uint uVar20;
  lyjson_ctx *plVar21;
  lysc_node *plVar22;
  lyd_node *parent_00;
  uint uVar23;
  ulong uVar24;
  lyd_node *plVar25;
  LY_ERR ret__;
  bool bVar26;
  LYJSON_PARSER_STATUS status;
  lyd_node *local_100;
  LYJSON_PARSER_STATUS status_1;
  lyd_node *local_f0;
  ly_ctx *local_e8;
  char *local_e0;
  char *local_d8;
  uint local_cc;
  lysc_node *local_c8;
  size_t local_c0;
  lyd_node *node;
  ly_ctx *local_b0;
  lysc_node *snode;
  char *local_a0;
  lysc_ext_instance *ext;
  size_t local_90;
  char *local_88;
  uint32_t val_hints;
  char *local_78;
  char *local_70;
  lys_module *local_68;
  char *local_60;
  uint local_58;
  uint local_54;
  lyd_meta **local_50;
  ly_set *local_48;
  size_t local_40;
  char *module_name;
  
  status = lyjson_ctx_status(lydctx->jsonctx);
  snode = (lysc_node *)0x0;
  ext = (lysc_ext_instance *)0x0;
  node = (lyd_node *)0x0;
  if (parent == (lyd_node *)0x0 && first_p == (lyd_node **)0x0) {
    __assert_fail("parent || first_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x630,
                  "LY_ERR lydjson_subtree_r(struct lyd_json_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  if (1 < status - LYJSON_OBJECT) {
    __assert_fail("(status == LYJSON_OBJECT) || (status == LYJSON_OBJECT_NEXT)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x631,
                  "LY_ERR lydjson_subtree_r(struct lyd_json_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  plVar17 = lydctx->jsonctx->ctx;
  uVar20 = lydctx->parse_opts;
  lydctx->parse_opts = uVar20 & 0xffbfffff;
  LVar4 = lyjson_ctx_next(lydctx->jsonctx,&status);
  if (LVar4 != LY_SUCCESS) {
    pcVar10 = (char *)0x0;
    goto LAB_00135335;
  }
  local_e8 = plVar17;
  if (status == LYJSON_OBJECT_CLOSED) {
    pcVar10 = (char *)0x0;
    LVar4 = LY_SUCCESS;
    goto LAB_00135335;
  }
  local_100 = parent;
  local_f0 = (lyd_node *)first_p;
  local_54 = uVar20;
  local_48 = parsed;
  if (status != LYJSON_OBJECT_NAME) {
    __assert_fail("status == LYJSON_OBJECT_NAME",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x63f,
                  "LY_ERR lydjson_subtree_r(struct lyd_json_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  plVar21 = lydctx->jsonctx;
  pcVar10 = plVar21->value;
  __n = plVar21->value_len;
  pvVar9 = memchr(pcVar10,0x3a,__n);
  cVar1 = *pcVar10;
  local_d8 = pcVar10 + (cVar1 == '@');
  if (pvVar9 == (void *)0x0) {
    local_c8 = (lysc_node *)(__n - (cVar1 == '@'));
    prefix_len = 0;
    pcVar11 = (char *)0x0;
  }
  else {
    prefix_len = (long)pvVar9 - (long)local_d8;
    local_c8 = (lysc_node *)((__n - (cVar1 == '@')) + ~prefix_len);
    pcVar11 = local_d8;
    local_d8 = (char *)((long)pvVar9 + 1);
  }
  if (plVar21->dynamic == '\0') {
    local_e0 = (char *)0x0;
  }
  else {
    plVar21->dynamic = '\0';
    local_e0 = pcVar10;
  }
  if ((((local_100 == (lyd_node *)0x0) && ((lydctx->int_opts & 0x80) != 0)) && (cVar1 != '@')) &&
     ((local_c8 != (lysc_node *)0x0 && (prefix_len == 0)))) {
    iVar5 = ly_strncmp("eventTime",local_d8,(size_t)local_c8);
    bVar26 = true;
    if (iVar5 == 0) {
      LVar4 = lyjson_ctx_next(lydctx->jsonctx,&status);
      pcVar10 = local_e0;
      if (LVar4 != LY_SUCCESS) goto LAB_00135335;
      plVar21 = lydctx->jsonctx;
      plVar17 = plVar21->ctx;
      if (status != LYJSON_STRING) {
        pcVar10 = lyjson_token2str(LYJSON_STRING);
        pcVar11 = lyjson_token2str(status);
        ly_vlog(plVar17,(char *)0x0,LYVE_SYNTAX_JSON,"Expecting JSON %s but %s found.",pcVar10,
                pcVar11);
LAB_001346e4:
        pcVar10 = local_e0;
        LVar4 = LY_EVALID;
        goto LAB_00135335;
      }
      LVar6 = LY_SUCCESS;
      LVar4 = lyd_create_opaq(plVar17,local_d8,(size_t)local_c8,pcVar11,0,pcVar11,0,plVar21->value,
                              plVar21->value_len,(ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,1,&node);
      pcVar10 = local_e0;
      if (LVar4 != LY_SUCCESS) goto LAB_00135335;
      LVar4 = lyd_parser_notif_eventtime_validate(node);
      parent_00 = local_100;
      plVar25 = local_f0;
      goto joined_r0x001348c0;
    }
LAB_001343eb:
    parent_00 = local_100;
    LVar4 = lydjson_get_snode(lydctx,cVar1 == '@',pcVar11,prefix_len,local_d8,(size_t)local_c8,
                              local_100,&snode,&ext);
    plVar25 = local_f0;
    if (LVar4 != LY_SUCCESS) {
      pcVar10 = local_e0;
      if (LVar4 == LY_ENOT) {
        LVar4 = LY_SUCCESS;
        goto LAB_00135335;
      }
      if ((LVar4 != LY_EVALID) || ((lydctx->val_opts & 4) == 0)) goto LAB_00135335;
      LVar4 = lydjson_data_skip(lydctx->jsonctx);
      LVar6 = LY_EVALID;
      if (LVar4 != LY_SUCCESS) {
        LVar6 = LVar4;
      }
      goto LAB_00134e9d;
    }
    local_c0 = prefix_len;
    if (snode == (lysc_node *)0x0) {
      if ((lydctx->parse_opts & 0x40000) != 0) {
        LVar6 = LY_SUCCESS;
        if (local_c8 == (lysc_node *)0x0) {
          ly_vlog(lydctx->jsonctx->ctx,(char *)0x0,LYVE_SYNTAX_JSON,
                  "JSON object member name cannot be a zero-length string.");
          plVar13 = ly_err_last(lydctx->jsonctx->ctx);
          pcVar10 = local_e0;
          LVar4 = LY_EVALID;
          if ((lydctx->val_opts & 4) == 0) goto LAB_00135335;
          LVar6 = LY_EVALID;
          LVar4 = LY_EVALID;
          if (plVar13->vecode == LYVE_SYNTAX) goto LAB_00135335;
        }
        LVar4 = lydjson_ctx_next_parse_opaq
                          (lydctx,local_d8,(size_t)local_c8,pcVar11,local_c0,parent_00,&status,
                           (lyd_node **)plVar25,&node);
        goto joined_r0x001348c0;
      }
      LVar4 = lydjson_data_skip(lydctx->jsonctx);
      pcVar10 = local_e0;
      if (LVar4 != LY_SUCCESS) goto LAB_00135335;
      plVar25 = local_f0;
      LVar6 = LY_SUCCESS;
      goto LAB_00134e43;
    }
    if (cVar1 == '@') goto LAB_00134373;
    LVar4 = lyjson_ctx_next(lydctx->jsonctx,&status);
    plVar17 = local_e8;
    plVar25 = local_f0;
    pcVar10 = local_e0;
    if (LVar4 != LY_SUCCESS) goto LAB_00135335;
    uVar2 = snode->nodetype;
    local_b0 = (ly_ctx *)0x0;
    uVar20 = (uint)uVar2;
    if (0x1f < uVar2) {
      if (uVar2 < 0x100) {
        if (uVar2 != 0x20) {
          if (uVar2 == 0x60) goto LAB_00134b35;
          goto LAB_00134b3c;
        }
        pcVar10 = "name/array";
LAB_00134cc2:
        local_b0 = (ly_ctx *)"name/value";
        if (status == LYJSON_ARRAY) {
          local_b0 = (ly_ctx *)pcVar10;
        }
        goto LAB_00134cd2;
      }
      if (((uVar2 == 0x100) || (uVar2 == 0x200)) || (uVar20 == 0x400)) {
LAB_00134b35:
        local_b0 = (ly_ctx *)0x1ca817;
      }
LAB_00134b3c:
      LVar6 = LY_SUCCESS;
      if (uVar20 == 0x5f || uVar2 < 0x5f) {
        if (uVar20 < 0x21) {
          if ((0x100000012U >> ((ulong)uVar20 & 0x3f) & 1) != 0) goto LAB_00134cd2;
          if ((0x10100UL >> ((ulong)uVar20 & 0x3f) & 1) != 0) goto LAB_00134bbe;
        }
      }
      else {
        LVar6 = LY_SUCCESS;
        if (uVar2 < 0x200) {
          if ((uVar2 == 0x60) || (uVar2 == 0x100)) {
LAB_00134cd2:
            LVar6 = lydjson_parse_instance
                              (lydctx,parent_00,(lyd_node **)local_f0,snode,ext,local_d8,
                               (size_t)local_c8,pcVar11,local_c0,&status,&node);
            if (LVar6 != LY_SUCCESS) {
              if (LVar6 == LY_ENOT) goto LAB_00134d14;
              plVar13 = ly_err_last(lydctx->jsonctx->ctx);
              pcVar10 = local_e0;
              LVar4 = LVar6;
              if ((LVar6 != LY_EVALID) || (LVar4 = LY_EVALID, (lydctx->val_opts & 4) == 0))
              goto LAB_00135335;
              LVar6 = LY_EVALID;
              LVar4 = LY_EVALID;
              if (plVar13->vecode == LYVE_SYNTAX) goto LAB_00135335;
            }
            if ((snode->nodetype & 0x700) != 0) {
              lydctx->op_node = node;
            }
          }
        }
        else if ((uVar2 == 0x200) || (uVar2 == 0x400)) goto LAB_00134cd2;
      }
      goto LAB_00134e43;
    }
    if (uVar2 < 8) {
      if (uVar2 == 1) goto LAB_00134b35;
      if (uVar2 == 4) {
        pcVar10 = "name/[null]";
        goto LAB_00134cc2;
      }
      goto LAB_00134b3c;
    }
    if (uVar2 == 8) {
      local_b0 = (ly_ctx *)0x1ca5e2;
    }
    else {
      local_b0 = (ly_ctx *)0x0;
      if (uVar2 != 0x10) goto LAB_00134b3c;
      local_b0 = (ly_ctx *)0x1ca5f7;
    }
LAB_00134bbe:
    if (status == LYJSON_ARRAY) {
      LVar6 = LY_SUCCESS;
      do {
        LVar4 = lyjson_ctx_next(lydctx->jsonctx,&status);
        pcVar10 = local_e0;
        if (LVar4 != LY_SUCCESS) goto LAB_00135335;
        if (status == LYJSON_ARRAY_CLOSED) break;
        LVar4 = lydjson_parse_instance
                          (lydctx,parent_00,(lyd_node **)plVar25,snode,ext,local_d8,(size_t)local_c8
                           ,pcVar11,local_c0,&status,&node);
        if (LVar4 != LY_SUCCESS) {
          plVar17 = local_e8;
          if (LVar4 == LY_ENOT) goto LAB_00134d14;
          plVar13 = ly_err_last(lydctx->jsonctx->ctx);
          pcVar10 = local_e0;
          if (LVar4 != LY_EVALID) goto LAB_00135335;
          if ((lydctx->val_opts & 4) == 0) goto LAB_001346e4;
          LVar6 = LY_EVALID;
          LVar4 = LY_EVALID;
          if (plVar13->vecode == LYVE_SYNTAX) goto LAB_00135335;
        }
        lydjson_maintain_children
                  (parent_00,(lyd_node **)plVar25,&node,(byte)(lydctx->parse_opts >> 0x15) & 1,ext);
        LVar4 = lyjson_ctx_next(lydctx->jsonctx,&status);
        pcVar10 = local_e0;
        if (LVar4 != LY_SUCCESS) goto LAB_00135335;
      } while (status == LYJSON_ARRAY_NEXT);
      goto LAB_00134e43;
    }
LAB_00134d14:
    pcVar11 = lys_nodetype2str(snode->nodetype);
    pcVar10 = snode->name;
    pcVar14 = lyjson_token2str(status);
    ly_vlog(plVar17,(char *)0x0,LYVE_SYNTAX_JSON,
            "Expecting JSON %s but %s \"%s\" is represented in input data as name/%s.",local_b0,
            pcVar11,pcVar10,pcVar14);
    pcVar10 = local_e0;
    LVar4 = LY_EVALID;
    if ((lydctx->val_opts & 4) == 0) goto LAB_00135335;
    LVar7 = lydjson_data_skip(lydctx->jsonctx);
    LVar6 = LY_EVALID;
  }
  else {
    bVar26 = local_c8 != (lysc_node *)0x0;
    if ((cVar1 != '@') || ((local_c8 != (lysc_node *)0x0 || (prefix_len != 0)))) goto LAB_001343eb;
    bVar26 = false;
    parent_00 = local_100;
LAB_00134373:
    bVar26 = (bool)(prefix_len != 0 | bVar26);
    if ((parent_00 != (lyd_node *)0x0) || (bVar26)) {
      LVar6 = LY_SUCCESS;
      if (bVar26) goto LAB_00134463;
      snode = parent_00->schema;
      LVar6 = LY_SUCCESS;
    }
    else {
      ly_vlog(local_e8,(char *)0x0,LYVE_SYNTAX_JSON,
              "Invalid metadata format - \"@\" can be used only inside anydata, container or list entries."
             );
      plVar13 = ly_err_last(lydctx->jsonctx->ctx);
      pcVar10 = local_e0;
      LVar4 = LY_EVALID;
      if ((lydctx->val_opts & 4) == 0) goto LAB_00135335;
      LVar6 = LY_EVALID;
      LVar4 = LY_EVALID;
      if (plVar13->vecode == LYVE_SYNTAX) goto LAB_00135335;
LAB_00134463:
      parent_00 = (lyd_node *)0x0;
    }
    plVar22 = snode;
    plVar25 = local_f0;
    local_90 = prefix_len;
    local_88 = pcVar11;
    plVar12 = plVar25;
    if (pcVar11 == (char *)0x0 && snode == (lysc_node *)0x0) {
      if (local_100 != (lyd_node *)0x0) {
        lydjson_get_node_prefix(local_100,(char *)0x0,0,&local_88,&local_90);
        goto LAB_0013455c;
      }
      local_88 = "";
      local_90 = 0;
      if (parent_00 == (lyd_node *)0x0) goto LAB_00134756;
LAB_00134715:
      plVar21 = lydctx->jsonctx;
      plVar17 = plVar21->ctx;
LAB_00134724:
      local_c0 = CONCAT62(local_c0._2_6_,1);
      local_c8 = plVar22;
    }
    else {
LAB_0013455c:
      if (parent_00 == (lyd_node *)0x0) {
        if (local_100 == (lyd_node *)0x0) {
LAB_00134756:
          for (parent_00 = *(lyd_node **)plVar12; parent_00 != (lyd_node *)0x0;
              parent_00 = parent_00->next) {
            plVar3 = parent_00->schema;
            if (plVar22 == (lysc_node *)0x0) {
              if (plVar3 == (lysc_node *)0x0) {
                plVar12 = parent_00[1].next;
                iVar5 = ly_strncmp((char *)parent_00[1].schema,local_d8,(size_t)local_c8);
                if (plVar12 != (lyd_node *)0x0 && iVar5 == 0) goto LAB_0013482c;
              }
              else {
                iVar5 = ly_strncmp(plVar3->name,local_d8,(size_t)local_c8);
                if (iVar5 == 0) {
                  plVar12 = (lyd_node *)parent_00->schema->module->name;
LAB_0013482c:
                  iVar5 = ly_strncmp((char *)plVar12,local_88,local_90);
                  if (iVar5 == 0) goto LAB_00134715;
                }
              }
            }
            else if (plVar3 == (lysc_node *)0x0) {
              plVar12 = parent_00[1].next;
              iVar5 = strcmp((char *)parent_00[1].schema,plVar22->name);
              if ((plVar12 != (lyd_node *)0x0 && iVar5 == 0) &&
                 (iVar5 = strcmp((char *)plVar12,plVar22->module->name), iVar5 == 0))
              goto LAB_00134962;
            }
            else if (plVar3 == plVar22) {
LAB_00134962:
              plVar17 = lydctx->jsonctx->ctx;
              goto LAB_00134578;
            }
          }
        }
        else if ((local_100->schema == (lysc_node *)0x0) ||
                ((local_100->schema->nodetype & 0x711) != 0)) {
          plVar12 = local_100 + 1;
          goto LAB_00134756;
        }
        parent_00 = local_100;
        uVar20 = lydctx->parse_opts;
        lydctx->parse_opts = uVar20 & 0xfff9ffff | 0x40000;
        pcVar10 = local_d8;
        if (local_88 != (char *)0x0) {
          pcVar10 = local_88;
        }
        name_len = local_c8->hash + (local_90 - 2);
        if (local_88 == (char *)0x0) {
          name_len = (uint8_t *)((long)&local_c8->nodetype + 1);
        }
        LVar4 = lydjson_ctx_next_parse_opaq
                          (lydctx,pcVar10 + -1,(size_t)name_len,(char *)0x0,0,local_100,&status,
                           (lyd_node **)plVar25,&node);
        lydctx->parse_opts = uVar20;
        goto joined_r0x001348c0;
      }
      plVar21 = lydctx->jsonctx;
      plVar17 = plVar21->ctx;
      if (plVar22 == (lysc_node *)0x0) goto LAB_00134724;
LAB_00134578:
      local_c0 = CONCAT62(local_c0._2_6_,plVar22->nodetype);
      local_c8 = plVar22;
      ly_log_location(plVar22,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      plVar21 = lydctx->jsonctx;
    }
    LVar4 = lyjson_ctx_next(plVar21,&status_1);
    if (LVar4 == LY_SUCCESS) {
      uVar20 = (uint)(ushort)local_c0;
      local_b0 = plVar17;
      uVar19 = (ushort)local_c0;
      if ((ushort)local_c0 < 0x20) {
        if ((ushort)local_c0 < 8) {
          if (uVar20 == 1) goto LAB_0013497f;
          if (uVar20 == 4) goto LAB_00134a5d;
        }
        else {
          if (uVar20 == 8) {
            local_e8 = (ly_ctx *)0x0;
            local_70 = "@name/array of objects/nulls";
            local_78 = (char *)0x0;
            plVar12 = parent_00;
            uVar23 = 0;
            LVar8 = LYJSON_ARRAY;
            if (status_1 == LYJSON_ARRAY) goto LAB_00135463;
            goto LAB_0013524f;
          }
          if (uVar20 == 0x10) goto LAB_0013497f;
        }
      }
      else if ((ushort)local_c0 < 0x100) {
        if ((ushort)local_c0 == 0x20) {
LAB_00134a5d:
          local_70 = "@name/object";
          local_78 = (char *)0x0;
          goto joined_r0x00134a8d;
        }
        if (uVar20 == 0x60) goto LAB_0013497f;
      }
      else if (((uVar20 == 0x100) || ((ushort)local_c0 == 0x200)) || ((ushort)local_c0 == 0x400)) {
LAB_0013497f:
        local_70 = "@/object";
        local_78 = "upled with metadata.";
joined_r0x00134a8d:
        local_e8 = (ly_ctx *)0x0;
        uVar23 = 0;
        if (status_1 == LYJSON_OBJECT) {
LAB_00134eb8:
          local_50 = &parent_00->meta;
          plVar25 = local_f0;
          local_cc = uVar20;
          local_58 = uVar23;
          do {
            LVar4 = lyjson_ctx_next(lydctx->jsonctx,&status_1);
            plVar17 = local_e8;
            if (LVar4 != LY_SUCCESS) goto LAB_00134747;
            if (status_1 != LYJSON_OBJECT_NAME) goto LAB_0013524b;
            plVar21 = lydctx->jsonctx;
            pcVar10 = plVar21->value;
            local_d8 = (char *)plVar21->value_len;
            pcVar11 = (char *)memchr(pcVar10,0x3a,(size_t)local_d8);
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + (long)(ulong)(cVar1 == '@');
            if (pcVar11 == (char *)0x0) {
              if (plVar21->dynamic != '\0') {
                free(local_e8);
                local_e8 = (ly_ctx *)plVar21->value;
                plVar21->dynamic = '\0';
              }
              if (local_d8 == (char *)(ulong)(cVar1 == '@')) {
LAB_001353aa:
                plVar25 = local_f0;
                parent_00 = local_100;
                ly_vlog(local_b0,(char *)0x0,LYVE_SYNTAX_JSON,
                        "Metadata in JSON found with an empty name, followed by: %.10s",pcVar10);
                plVar17 = local_e8;
              }
              else {
LAB_001353d1:
                plVar25 = local_f0;
                parent_00 = local_100;
                ly_vlog(local_b0,(char *)0x0,LYVE_SYNTAX_JSON,
                        "Metadata in JSON must be namespace-qualified, missing prefix for \"%.*s\"."
                        ,(ulong)(uint)lydctx->jsonctx->value_len,lydctx->jsonctx->value);
                plVar17 = local_e8;
              }
              goto LAB_001352d9;
            }
            local_a0 = (char *)CONCAT71(local_a0._1_7_,cVar1);
            bVar18 = cVar1 == '@';
            local_60 = pcVar10;
            if (plVar21->dynamic != '\0') {
              local_68 = (lys_module *)CONCAT71(local_68._1_7_,cVar1 == '@');
              free(local_e8);
              local_e8 = (ly_ctx *)plVar21->value;
              plVar21->dynamic = '\0';
              bVar18 = (byte)local_68;
            }
            plVar17 = local_b0;
            uVar24 = (long)pcVar11 - (long)local_60;
            pcVar10 = pcVar11 + 1;
            if (local_d8 + (~uVar24 - (ulong)bVar18) == (char *)0x0) goto LAB_001353aa;
            if (pcVar11 == local_60) goto LAB_001353d1;
            if ((char)local_a0 == '@') {
              ly_vlog(local_b0,(char *)0x0,LYVE_SYNTAX_JSON,
                      "Invalid format of the Metadata identifier in JSON, unexpected \'@\' in \"%.*s\""
                      ,(ulong)(uint)lydctx->jsonctx->value_len,lydctx->jsonctx->value);
              plVar17 = local_e8;
              parent_00 = local_100;
              plVar25 = local_f0;
              goto LAB_001352d9;
            }
            local_d8 = local_d8 + (~uVar24 - (ulong)bVar18);
            local_a0 = pcVar10;
            plVar15 = ly_ctx_get_module_implemented2(local_b0,local_60,uVar24);
            if (plVar15 == (lys_module *)0x0) {
              if ((lydctx->parse_opts >> 0x11 & 1) != 0) {
                pcVar14 = 
                "Prefix \"%.*s\" of the metadata \"%.*s\" does not match any module in the context."
                ;
                uVar24 = uVar24 & 0xffffffff;
                pcVar10 = local_60;
                pcVar11 = local_d8;
                goto LAB_00135546;
              }
              if (parent_00->schema == (lysc_node *)0x0) {
                if ((lydctx->parse_opts >> 0x12 & 1) == 0) {
                  __assert_fail("lydctx->parse_opts & LYD_PARSE_OPAQ",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                                ,0x350,
                                "LY_ERR lydjson_metadata(struct lyd_json_ctx *, const struct lysc_node *, struct lyd_node *)"
                               );
                }
                goto LAB_00134fde;
              }
              LVar4 = lydjson_data_skip(lydctx->jsonctx);
              plVar17 = local_e8;
              plVar25 = local_f0;
              if (LVar4 != LY_SUCCESS) goto LAB_00134747;
              status_1 = lyjson_ctx_status(lydctx->jsonctx);
              plVar25 = local_f0;
            }
            else {
LAB_00134fde:
              local_68 = plVar15;
              LVar4 = lyjson_ctx_next(lydctx->jsonctx,&status_1);
              plVar17 = local_e8;
              plVar25 = local_f0;
              if ((LVar4 != LY_SUCCESS) ||
                 (LVar4 = lydjson_value_type_hint(lydctx->jsonctx,&status_1,&val_hints),
                 pcVar10 = local_60, plVar17 = local_e8, plVar25 = local_f0, LVar4 != LY_SUCCESS))
              goto LAB_00134747;
              if (parent_00->schema == (lysc_node *)0x0) {
                lydjson_get_node_prefix(parent_00,local_60,uVar24,&module_name,&local_40);
                plVar21 = lydctx->jsonctx;
                LVar4 = lyd_create_attr(parent_00,(lyd_attr **)0x0,plVar21->ctx,local_a0,
                                        (size_t)local_d8,pcVar10,uVar24,module_name,local_40,
                                        plVar21->value,plVar21->value_len,&plVar21->dynamic,
                                        LY_VALUE_JSON,(void *)0x0,val_hints);
                plVar25 = local_f0;
              }
              else {
                plVar21 = lydctx->jsonctx;
                LVar4 = lyd_parser_create_meta
                                  ((lyd_ctx *)lydctx,parent_00,(lyd_meta **)0x0,local_68,local_a0,
                                   (size_t)local_d8,plVar21->value,plVar21->value_len,
                                   &plVar21->dynamic,LY_VALUE_JSON,(void *)0x0,val_hints,
                                   parent_00->schema);
                plVar25 = local_f0;
                plVar17 = local_e8;
                if (LVar4 != LY_SUCCESS) goto LAB_00134747;
                LVar4 = lyd_parser_set_data_flags
                                  (parent_00,local_50,(lyd_ctx *)lydctx,(lysc_ext_instance *)0x0);
              }
              plVar17 = local_e8;
              if ((LVar4 != LY_SUCCESS) ||
                 (LVar4 = lyjson_ctx_next(lydctx->jsonctx,&status_1), plVar17 = local_e8,
                 LVar4 != LY_SUCCESS)) goto LAB_00134747;
            }
          } while (status_1 == LYJSON_OBJECT_NEXT);
          if (status_1 == LYJSON_OBJECT_CLOSED) {
            if ((ushort)local_c0 == 8) {
              plVar25 = parent_00->next;
              LVar4 = lyjson_ctx_next(lydctx->jsonctx,&status_1);
              plVar17 = local_e8;
              plVar12 = parent_00;
              parent_00 = plVar25;
              plVar25 = local_f0;
              uVar23 = local_58;
              uVar20 = local_cc;
              LVar8 = status_1;
              if (LVar4 == LY_SUCCESS) {
LAB_00135463:
                if (LVar8 == LYJSON_ARRAY_CLOSED) goto LAB_001354fe;
                local_cc = uVar20;
                LVar4 = lyjson_ctx_next(lydctx->jsonctx,&status_1);
                plVar17 = local_e8;
                plVar25 = local_f0;
                if (LVar4 != LY_SUCCESS) goto LAB_00134747;
                uVar23 = uVar23 + 1;
                if ((status_1 != LYJSON_NULL) && (status_1 != LYJSON_OBJECT)) {
                  pcVar10 = lys_nodetype2str((uint16_t)local_cc);
                  if (parent_00 != (lyd_node *)0x0) goto LAB_00135257;
                  if (plVar12->schema == (lysc_node *)0x0) {
                    pplVar16 = &plVar12[1].schema;
                  }
                  else {
                    pplVar16 = (lysc_node **)&plVar12->schema->name;
                  }
                  goto LAB_00135278;
                }
                if (parent_00 == (lyd_node *)0x0) {
                  plVar22 = plVar12->schema;
LAB_00135519:
                  plVar17 = lydctx->jsonctx->ctx;
                  pcVar14 = "Missing JSON data instance #%u of %s:%s to be coupled with metadata.";
                  uVar24 = (ulong)uVar23;
                  pcVar10 = plVar22->module->name;
                  pcVar11 = plVar22->name;
LAB_00135546:
                  ly_vlog(plVar17,(char *)0x0,LYVE_REFERENCE,pcVar14,uVar24,pcVar10,pcVar11);
                  plVar17 = local_e8;
                  parent_00 = local_100;
                  plVar25 = local_f0;
                  goto LAB_001352d9;
                }
                plVar22 = plVar12->schema;
                if (parent_00->schema != plVar22) goto LAB_00135519;
                uVar20 = local_cc;
                if (status_1 != LYJSON_OBJECT) goto code_r0x001354b2;
                goto LAB_00134eb8;
              }
              goto LAB_00134747;
            }
LAB_001354fe:
            plVar17 = local_e8;
            parent_00 = local_100;
            plVar25 = local_f0;
            LVar4 = LY_SUCCESS;
            goto LAB_00135304;
          }
LAB_0013524b:
          uVar19 = (uint16_t)local_cc;
        }
LAB_0013524f:
        pcVar10 = lys_nodetype2str(uVar19);
LAB_00135257:
        if (parent_00->schema == (lysc_node *)0x0) {
          pplVar16 = &parent_00[1].schema;
        }
        else {
          pplVar16 = (lysc_node **)&parent_00->schema->name;
        }
LAB_00135278:
        plVar25 = local_f0;
        parent_00 = local_100;
        plVar22 = *pplVar16;
        pcVar11 = lyjson_token2str(status_1);
        pcVar14 = "";
        if ((char)local_78 == '\0') {
          pcVar14 = "name";
        }
        ly_vlog(local_b0,(char *)0x0,LYVE_SYNTAX_JSON,
                "The attribute(s) of %s \"%s\" is expected to be represented as JSON %s, but input data contains @%s/%s."
                ,pcVar10,plVar22,local_70,pcVar11,pcVar14);
        plVar17 = local_e8;
        goto LAB_001352d9;
      }
      ly_log(plVar17,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c",
             0x322);
      plVar17 = (ly_ctx *)0x0;
      parent_00 = local_100;
      LVar4 = LY_EINT;
    }
    else {
      plVar17 = (ly_ctx *)0x0;
LAB_00134747:
      parent_00 = local_100;
      if (LVar4 == LY_EVALID) {
LAB_001352d9:
        LVar4 = LY_EVALID;
        if ((lydctx->val_opts & 4) != 0) {
          LVar7 = lydjson_data_skip(lydctx->jsonctx);
          LVar4 = LY_EVALID;
          if (LVar7 != LY_SUCCESS) {
            LVar4 = LVar7;
          }
        }
      }
    }
LAB_00135304:
    bVar26 = local_c8 != (lysc_node *)0x0;
    free(plVar17);
    ly_log_location_revert((uint)bVar26,0,0,0);
joined_r0x001348c0:
    pcVar10 = local_e0;
    if (LVar4 != LY_SUCCESS) goto LAB_00135335;
LAB_00134e43:
    if (node != (lyd_node *)0x0 && local_48 != (ly_set *)0x0) {
      ly_set_add(local_48,node,'\x01',(uint32_t *)0x0);
    }
    lydjson_maintain_children
              (parent_00,(lyd_node **)plVar25,&node,(byte)(lydctx->parse_opts >> 0x15) & 1,ext);
    pcVar10 = local_e0;
    LVar4 = LVar6;
    if ((local_54 >> 0x16 & 1) != 0) goto LAB_00135335;
LAB_00134e9d:
    LVar7 = lyjson_ctx_next(lydctx->jsonctx,&status);
  }
  pcVar10 = local_e0;
  LVar4 = LVar6;
  if (LVar7 != LY_SUCCESS) {
    LVar4 = LVar7;
  }
LAB_00135335:
  free(pcVar10);
  lyd_free_tree(node);
  return LVar4;
code_r0x001354b2:
  if (status_1 != LYJSON_NULL) {
    __assert_fail("status == LYJSON_OBJECT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x328,
                  "LY_ERR lydjson_metadata(struct lyd_json_ctx *, const struct lysc_node *, struct lyd_node *)"
                 );
  }
  plVar25 = parent_00->next;
  LVar4 = lyjson_ctx_next(lydctx->jsonctx,&status_1);
  plVar17 = local_e8;
  plVar12 = parent_00;
  parent_00 = plVar25;
  plVar25 = local_f0;
  uVar20 = local_cc;
  LVar8 = status_1;
  if (LVar4 != LY_SUCCESS) goto LAB_00134747;
  goto LAB_00135463;
}

Assistant:

static LY_ERR
lydjson_subtree_r(struct lyd_json_ctx *lydctx, struct lyd_node *parent, struct lyd_node **first_p, struct ly_set *parsed)
{
    LY_ERR r, rc = LY_SUCCESS;
    enum LYJSON_PARSER_STATUS status = lyjson_ctx_status(lydctx->jsonctx);
    const char *name, *prefix = NULL, *expected = NULL;
    size_t name_len, prefix_len = 0;
    ly_bool is_meta = 0, parse_subtree;
    const struct lysc_node *snode = NULL;
    struct lysc_ext_instance *ext = NULL;
    struct lyd_node *node = NULL, *attr_node = NULL;
    const struct ly_ctx *ctx = lydctx->jsonctx->ctx;
    char *value = NULL;

    assert(parent || first_p);
    assert((status == LYJSON_OBJECT) || (status == LYJSON_OBJECT_NEXT));

    parse_subtree = lydctx->parse_opts & LYD_PARSE_SUBTREE ? 1 : 0;
    /* all descendants should be parsed */
    lydctx->parse_opts &= ~LYD_PARSE_SUBTREE;

    r = lyjson_ctx_next(lydctx->jsonctx, &status);
    LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    if (status == LYJSON_OBJECT_CLOSED) {
        /* empty object, fine... */
        goto cleanup;
    }

    /* process the node name */
    assert(status == LYJSON_OBJECT_NAME);
    lydjson_parse_name(lydctx->jsonctx->value, lydctx->jsonctx->value_len, &name, &name_len, &prefix, &prefix_len, &is_meta);
    lyjson_ctx_give_dynamic_value(lydctx->jsonctx, &value);

    if ((lydctx->int_opts & LYD_INTOPT_EVENTTIME) && !parent && !is_meta && name_len && !prefix_len &&
            !ly_strncmp("eventTime", name, name_len)) {
        /* parse eventTime */
        r = lyjson_ctx_next(lydctx->jsonctx, &status);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        if (status != LYJSON_STRING) {
            LOGVAL(lydctx->jsonctx->ctx, LYVE_SYNTAX_JSON, "Expecting JSON %s but %s found.", lyjson_token2str(LYJSON_STRING),
                    lyjson_token2str(status));
            rc = LY_EVALID;
            goto cleanup;
        }

        /* create node */
        r = lyd_create_opaq(lydctx->jsonctx->ctx, name, name_len, prefix, prefix_len, prefix, prefix_len,
                lydctx->jsonctx->value, lydctx->jsonctx->value_len, NULL, LY_VALUE_JSON, NULL, LYD_VALHINT_STRING, &node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        /* validate the value */
        r = lyd_parser_notif_eventtime_validate(node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        goto node_parsed;
    } else if (!is_meta || name_len || prefix_len) {
        /* get the schema node */
        r = lydjson_get_snode(lydctx, is_meta, prefix, prefix_len, name, name_len, parent, &snode, &ext);
        if (r == LY_ENOT) {
            /* data parsed */
            goto cleanup;
        } else if ((r == LY_EVALID) && (lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR)) {
            rc = r;

            /* skip the invalid data */
            if ((r = lydjson_data_skip(lydctx->jsonctx))) {
                rc = r;
            }
            r = lyjson_ctx_next(lydctx->jsonctx, &status);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
            goto cleanup;
        } else if (r) {
            /* error */
            rc = r;
            goto cleanup;
        }

        if (!snode) {
            /* we will not be parsing it as metadata */
            is_meta = 0;
        }
    }

    if (is_meta) {
        /* parse as metadata */
        if (!name_len && !prefix_len && !parent) {
            LOGVAL(ctx, LYVE_SYNTAX_JSON,
                    "Invalid metadata format - \"@\" can be used only inside anydata, container or list entries.");
            r = LY_EVALID;
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
        } else if (!name_len && !prefix_len) {
            /* parent's metadata without a name - use the schema from the parent */
            attr_node = parent;
            snode = attr_node->schema;
        }
        r = lydjson_parse_attribute(lydctx, attr_node, snode, name, name_len, prefix, prefix_len, parent, &status,
                first_p, &node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    } else if (!snode) {
        if (!(lydctx->parse_opts & LYD_PARSE_OPAQ)) {
            /* skip element with children */
            r = lydjson_data_skip(lydctx->jsonctx);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        } else {
            /* parse as an opaq node */

            /* opaq node cannot have an empty string as the name. */
            if (name_len == 0) {
                LOGVAL(lydctx->jsonctx->ctx, LYVE_SYNTAX_JSON, "JSON object member name cannot be a zero-length string.");
                r = LY_EVALID;
                LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
            }

            /* move to the second item in the name/X pair and parse opaq */
            r = lydjson_ctx_next_parse_opaq(lydctx, name, name_len, prefix, prefix_len, parent, &status, first_p, &node);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        }
    } else {
        /* parse as a standard lyd_node but it can still turn out to be an opaque node */

        /* move to the second item in the name/X pair */
        r = lyjson_ctx_next(lydctx->jsonctx, &status);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        /* set expected representation */
        switch (snode->nodetype) {
        case LYS_LEAFLIST:
            expected = "name/array of values";
            break;
        case LYS_LIST:
            expected = "name/array of objects";
            break;
        case LYS_LEAF:
            if (status == LYJSON_ARRAY) {
                expected = "name/[null]";
            } else {
                expected = "name/value";
            }
            break;
        case LYS_CONTAINER:
        case LYS_NOTIF:
        case LYS_ACTION:
        case LYS_RPC:
        case LYS_ANYDATA:
            expected = "name/object";
            break;
        case LYS_ANYXML:
            if (status == LYJSON_ARRAY) {
                expected = "name/array";
            } else {
                expected = "name/value";
            }
            break;
        }

        /* check the representation according to the nodetype and then continue with the content */
        switch (snode->nodetype) {
        case LYS_LEAFLIST:
        case LYS_LIST:
            LY_CHECK_GOTO(status != LYJSON_ARRAY, representation_error);

            /* process all the values/objects */
            do {
                /* move into array/next value */
                r = lyjson_ctx_next(lydctx->jsonctx, &status);
                LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
                if (status == LYJSON_ARRAY_CLOSED) {
                    /* empty array, fine... */
                    break;
                }

                r = lydjson_parse_instance(lydctx, parent, first_p, snode, ext, name, name_len, prefix, prefix_len,
                        &status, &node);
                if (r == LY_ENOT) {
                    goto representation_error;
                }
                LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

                lydjson_maintain_children(parent, first_p, &node,
                        lydctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT, ext);

                /* move after the item(s) */
                r = lyjson_ctx_next(lydctx->jsonctx, &status);
                LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
            } while (status == LYJSON_ARRAY_NEXT);

            break;
        case LYS_LEAF:
        case LYS_CONTAINER:
        case LYS_NOTIF:
        case LYS_ACTION:
        case LYS_RPC:
        case LYS_ANYDATA:
        case LYS_ANYXML:
            /* process the value/object */
            r = lydjson_parse_instance(lydctx, parent, first_p, snode, ext, name, name_len, prefix, prefix_len,
                    &status, &node);
            if (r == LY_ENOT) {
                goto representation_error;
            }
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

            if (snode->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)) {
                /* rememeber the RPC/action/notification */
                lydctx->op_node = node;
            }
            break;
        }
    }

node_parsed:
    /* rememeber a successfully parsed node */
    if (parsed && node) {
        ly_set_add(parsed, node, 1, NULL);
    }

    /* finally connect the parsed node, is zeroed */
    lydjson_maintain_children(parent, first_p, &node,
            lydctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT, ext);

    if (!parse_subtree) {
        /* move after the item(s) */
        r = lyjson_ctx_next(lydctx->jsonctx, &status);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    }

    /* success */
    goto cleanup;

representation_error:
    LOGVAL(ctx, LYVE_SYNTAX_JSON, "Expecting JSON %s but %s \"%s\" is represented in input data as name/%s.",
            expected, lys_nodetype2str(snode->nodetype), snode->name, lyjson_token2str(status));
    rc = LY_EVALID;
    if (lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR) {
        /* try to skip the invalid data */
        if ((r = lydjson_data_skip(lydctx->jsonctx))) {
            rc = r;
        }
    }

cleanup:
    free(value);
    lyd_free_tree(node);
    return rc;
}